

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O3

double __thiscall Imath_3_2::Vec3<double>::lengthTiny(Vec3<double> *this)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar3 = this->x;
  dVar5 = this->y;
  uVar1 = -(ulong)(dVar3 < -dVar3);
  uVar2 = -(ulong)(dVar5 < -dVar5);
  dVar4 = (double)(~uVar1 & (ulong)dVar3 | (ulong)-dVar3 & uVar1);
  dVar5 = (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2);
  dVar3 = this->z;
  uVar1 = -(ulong)(dVar3 < -dVar3);
  dVar6 = (double)(~uVar1 & (ulong)dVar3 | (ulong)-dVar3 & uVar1);
  dVar3 = dVar5;
  if (dVar5 <= dVar4) {
    dVar3 = dVar4;
  }
  dVar7 = dVar6;
  if (dVar6 <= dVar3) {
    dVar7 = dVar3;
  }
  dVar3 = 0.0;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    dVar3 = SQRT((dVar6 / dVar7) * (dVar6 / dVar7) +
                 (dVar4 / dVar7) * (dVar4 / dVar7) + (dVar5 / dVar7) * (dVar5 / dVar7)) * dVar7;
  }
  return dVar3;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec3<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = (x >= T (0)) ? x : -x;
    T absY = (y >= T (0)) ? y : -y;
    T absZ = (z >= T (0)) ? z : -z;

    T max = absX;

    if (max < absY) max = absY;

    if (max < absZ) max = absZ;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;

    return max * std::sqrt (absX * absX + absY * absY + absZ * absZ);
}